

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O2

bool __thiscall
MeCab::Writer::writeNode(Writer *this,Lattice *lattice,char *p,Node *node,StringBuffer *os)

{
  uchar *puVar1;
  byte bVar2;
  byte bVar3;
  Node *pNVar4;
  char cVar5;
  byte bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Node *__n;
  char **extraout_RDX;
  void *__buf;
  char **extraout_RDX_00;
  char **extraout_RDX_01;
  char **extraout_RDX_02;
  char **extraout_RDX_03;
  char **extraout_RDX_04;
  char **extraout_RDX_05;
  char **extraout_RDX_06;
  char **extraout_RDX_07;
  char **extraout_RDX_08;
  uint *__buf_00;
  char **extraout_RDX_09;
  char **extraout_RDX_10;
  char **extraout_RDX_11;
  char **__buf_01;
  char **extraout_RDX_12;
  char **extraout_RDX_13;
  char **extraout_RDX_14;
  char **extraout_RDX_15;
  char **extraout_RDX_16;
  char **extraout_RDX_17;
  char **extraout_RDX_18;
  char **extraout_RDX_19;
  char **extraout_RDX_20;
  char **extraout_RDX_21;
  char **extraout_RDX_22;
  char **extraout_RDX_23;
  char **extraout_RDX_24;
  byte *pbVar11;
  ulong uVar12;
  mecab_path_t *pmVar13;
  long n;
  char *pcVar14;
  allocator local_d9;
  size_t local_d8;
  Node *local_d0;
  Node *local_c8;
  Node *local_c0;
  scoped_fixed_array<char_*,_64> ptr;
  scoped_fixed_array<char,_8192> buf;
  string error;
  void *pvVar10;
  
  buf._vptr_scoped_fixed_array = (_func_int **)&PTR__scoped_fixed_array_0016bb18;
  __n = node;
  buf.ptr_ = (char *)operator_new__(0x2000);
  buf.size_ = 0x2000;
  ptr._vptr_scoped_fixed_array = (_func_int **)&PTR__scoped_fixed_array_0016bcd0;
  ptr.ptr_ = (char **)operator_new__(0x200);
  ptr.size_ = 0x40;
  local_c8 = (Node *)&node->length;
  local_c0 = (Node *)&node->prob;
  puVar1 = &node->char_type;
  local_d8 = 0;
  __buf_00 = (uint *)extraout_RDX;
  local_d0 = node;
  while (pcVar14 = buf.ptr_, bVar2 = *p, bVar2 != 0) {
    if (bVar2 != 0x25) {
      if (bVar2 == 0x5c) {
        cVar5 = getEscapedChar(((byte *)p)[1]);
        StringBuffer::write(os,(int)cVar5,__buf,(size_t)__n);
        pbVar11 = (byte *)p + 1;
        __buf_00 = (uint *)extraout_RDX_00;
      }
      else {
        StringBuffer::write(os,(int)(char)bVar2,__buf_00,(size_t)__n);
        __buf_00 = (uint *)extraout_RDX_02;
        pbVar11 = (byte *)p;
      }
      goto LAB_0012b450;
    }
    pbVar11 = (byte *)p + 1;
    bVar3 = ((byte *)p)[1];
    __n = (Node *)(ulong)bVar3;
    pvVar10 = (void *)(ulong)(bVar3 - 0x46);
    if (bVar3 - 0x46 < 0xe) {
      __n = (Node *)((long)&switchD_0012b46e::switchdataD_00151488 +
                    (long)(int)(&switchD_0012b46e::switchdataD_00151488)[(long)pvVar10]);
      pNVar4 = __n;
      switch(pvVar10) {
      case (void *)0x0:
        goto switchD_0012b430_caseD_66;
      default:
        goto switchD_0012b430_caseD_67;
      case (void *)0x2:
        StringBuffer::write(os,(int)local_d0->feature,pvVar10,(size_t)__n);
        __buf_00 = (uint *)extraout_RDX_04;
        break;
      case (void *)0x6:
        iVar8 = (*lattice->_vptr_Lattice[0xb])(lattice);
        StringBuffer::operator<<(os,CONCAT44(extraout_var_00,iVar8));
        __buf_00 = (uint *)extraout_RDX_05;
        break;
      case (void *)0x7:
        pvVar10 = (void *)(ulong)local_d0->rlength;
        __n = (Node *)(local_d0->surface + -(long)pvVar10);
        iVar8 = (uint)local_d0->length + (int)__n;
        goto LAB_0012b599;
      case (void *)0xa:
        StringBuffer::operator<<(os,(double)*(float *)&local_c0->prev);
        __buf_00 = (uint *)extraout_RDX_06;
        break;
      case (void *)0xd:
        iVar8 = (*lattice->_vptr_Lattice[8])(lattice);
        iVar9 = (*lattice->_vptr_Lattice[0xb])(lattice);
        pvVar10 = (void *)CONCAT44(extraout_var,iVar9);
LAB_0012b599:
        StringBuffer::write(os,iVar8,pvVar10,(size_t)__n);
        __buf_00 = (uint *)extraout_RDX_08;
      }
    }
    else {
      pNVar4 = (Node *)puVar1;
      switch((void *)(ulong)(bVar3 - 0x66)) {
      case (void *)0x0:
switchD_0012b430_caseD_66:
        __n = pNVar4;
        if (*local_d0->feature == '\0') {
          pcVar14 = "no feature information available";
LAB_0012b8dc:
          (*lattice->_vptr_Lattice[0x25])(lattice,pcVar14);
        }
        else {
          if (local_d8 == 0) {
            strncpy(buf.ptr_,local_d0->feature,buf.size_);
            local_d8 = tokenizeCSV<char**>(pcVar14,ptr.ptr_,ptr.size_);
            bVar3 = *pbVar11;
          }
          bVar6 = 9;
          if (bVar3 == 0x46) {
            bVar6 = ((byte *)p)[2];
            if (bVar6 == 0x5c) {
              pbVar11 = (byte *)p + 3;
              bVar6 = getEscapedChar(((byte *)p)[3]);
            }
            else {
              pbVar11 = (byte *)p + 2;
            }
          }
          if (pbVar11[1] == 0x5b) {
            pbVar11 = pbVar11 + 2;
            uVar12 = 0;
            bVar7 = false;
            while( true ) {
              bVar3 = *pbVar11;
              __n = (Node *)CONCAT71((int7)((ulong)__n >> 8),bVar3);
              if (9 < bVar3 - 0x30) break;
              __n = (Node *)(uVar12 * 10);
              uVar12 = (long)__n + ((ulong)bVar3 - 0x30);
LAB_0012b636:
              pbVar11 = pbVar11 + 1;
            }
            if ((bVar3 == 0x2c) || (bVar3 == 0x5d)) {
              if (uVar12 < local_d8) {
                pcVar14 = ptr.ptr_[uVar12];
                cVar5 = *pcVar14;
                __buf_00 = (uint *)ptr.ptr_;
                if (cVar5 != '*') {
                  __buf_01 = ptr.ptr_;
                  if (bVar7) {
                    StringBuffer::write(os,(int)(char)bVar6,ptr.ptr_,(size_t)__n);
                    pcVar14 = ptr.ptr_[uVar12];
                    __buf_01 = extraout_RDX_11;
                  }
                  StringBuffer::write(os,(int)pcVar14,__buf_01,(size_t)__n);
                  __n = (Node *)CONCAT71((int7)((ulong)__n >> 8),*pbVar11);
                  __buf_00 = (uint *)extraout_RDX_12;
                }
                if ((char)__n != ']') {
                  uVar12 = 0;
                  bVar7 = cVar5 != '*';
                  goto LAB_0012b636;
                }
                break;
              }
              pcVar14 = "given index is out of range";
            }
            else {
              pcVar14 = "cannot find \']\'";
            }
            (*lattice->_vptr_Lattice[0x25])(lattice,pcVar14);
          }
          else {
            (*lattice->_vptr_Lattice[0x25])(lattice,"cannot find \'[\'");
          }
        }
        goto LAB_0012b8a8;
      case (void *)0x1:
      case (void *)0x3:
      case (void *)0x4:
      case (void *)0x5:
      case (void *)0x6:
      case (void *)0x8:
      case (void *)0x9:
      case (void *)0xb:
      case (void *)0xc:
switchD_0012b430_caseD_67:
        std::__cxx11::string::string((string *)&error,"unknown meta char: " + (char)bVar3,&local_d9)
        ;
        (*lattice->_vptr_Lattice[0x25])(lattice,error._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&error);
        goto LAB_0012b8a8;
      case (void *)0x2:
        __n = (Node *)puVar1;
        StringBuffer::operator<<(os,local_d0->posid);
        __buf_00 = (uint *)extraout_RDX_01;
        break;
      case (void *)0x7:
        iVar8 = (int)local_d0->surface;
        pvVar10 = (void *)(ulong)local_d0->length;
        __n = (Node *)puVar1;
        goto LAB_0012b599;
      case (void *)0xa:
        pbVar11 = (byte *)p + 2;
        bVar3 = ((byte *)p)[2];
        __buf_00 = &switchD_0012b5d3::switchdataD_001514fc;
        __n = local_c8;
        switch(bVar3) {
        case 0x62:
          iVar8 = 0x2a;
          if (local_d0->isbest == '\0') {
            iVar8 = 0x20;
          }
          StringBuffer::write(os,iVar8,&switchD_0012b5d3::switchdataD_001514fc,(size_t)local_c8);
          __buf_00 = (uint *)extraout_RDX_09;
          break;
        case 99:
          n = local_d0->cost;
          goto LAB_0012b7f6;
        case 100:
        case 0x66:
        case 0x67:
        case 0x6a:
        case 0x6b:
        case 0x6d:
        case 0x6f:
        case 0x71:
        case 0x72:
        case 0x74:
        case 0x75:
        case 0x76:
switchD_0012b5d3_caseD_64:
          pcVar14 = "[iseSCwcnblLh] is required after %p";
          goto LAB_0012b8dc;
        case 0x65:
          pcVar14 = local_d0->surface;
          iVar8 = (*lattice->_vptr_Lattice[8])(lattice);
          iVar8 = (uint)*(ushort *)&local_c8->prev + ((int)pcVar14 - iVar8);
          goto LAB_0012b76f;
        case 0x68:
          __n = (Node *)&node->rcAttr;
          if ((((byte *)p)[3] != 0x72) && (__n = (Node *)&node->lcAttr, ((byte *)p)[3] != 0x6c)) {
            pcVar14 = "lr is required after %ph";
            goto LAB_0012b8dc;
          }
          StringBuffer::operator<<(os,*(unsigned_short *)&__n->prev);
          pbVar11 = (byte *)p + 3;
          __buf_00 = (uint *)extraout_RDX_19;
          break;
        case 0x69:
          StringBuffer::operator<<(os,local_d0->id);
          __buf_00 = (uint *)extraout_RDX_16;
          break;
        case 0x6c:
switchD_0012b5d3_caseD_6c:
          StringBuffer::operator<<(os,*(unsigned_short *)&__n->prev);
          __buf_00 = (uint *)extraout_RDX_15;
          break;
        case 0x6e:
          n = local_d0->cost - local_d0->prev->cost;
LAB_0012b7f6:
          StringBuffer::operator<<(os,n);
          __buf_00 = (uint *)extraout_RDX_21;
          break;
        case 0x70:
          bVar3 = ((byte *)p)[3];
          bVar6 = ((byte *)p)[4];
          if (bVar6 == 0x5c) {
            pbVar11 = (byte *)p + 5;
            bVar6 = getEscapedChar(((byte *)p)[5]);
            __buf_00 = (uint *)extraout_RDX_20;
          }
          else {
            pbVar11 = (byte *)p + 4;
          }
          pmVar13 = local_d0->lpath;
          if (pmVar13 == (mecab_path_t *)0x0) {
            (*lattice->_vptr_Lattice[0x25])(lattice,"no path information is available");
            goto LAB_0012b8a8;
          }
          for (; pmVar13 != (mecab_path_t *)0x0; pmVar13 = pmVar13->lnext) {
            if (pmVar13 != local_d0->lpath) {
              StringBuffer::write(os,(int)(char)bVar6,__buf_00,(size_t)__n);
            }
            if (bVar3 == 0x50) {
              StringBuffer::operator<<(os,(double)pmVar13->prob);
              __buf_00 = (uint *)extraout_RDX_24;
            }
            else if (bVar3 == 99) {
              StringBuffer::operator<<(os,pmVar13->cost);
              __buf_00 = (uint *)extraout_RDX_23;
            }
            else {
              if (bVar3 != 0x69) {
                (*lattice->_vptr_Lattice[0x25])(lattice,"[icP] is required after %pp");
                goto LAB_0012b8a8;
              }
              StringBuffer::operator<<(os,pmVar13->lnode->id);
              __buf_00 = (uint *)extraout_RDX_22;
            }
          }
          break;
        case 0x73:
          pcVar14 = local_d0->surface;
          iVar8 = (*lattice->_vptr_Lattice[8])(lattice);
          iVar8 = (int)pcVar14 - iVar8;
LAB_0012b76f:
          StringBuffer::operator<<(os,iVar8);
          __buf_00 = (uint *)extraout_RDX_18;
          break;
        case 0x77:
          StringBuffer::operator<<(os,local_d0->wcost);
          __buf_00 = (uint *)extraout_RDX_17;
          break;
        default:
          __n = (Node *)&node->alpha;
          if ((bVar3 != 0x41) && (__n = (Node *)&node->beta, bVar3 != 0x42)) {
            if (bVar3 == 0x43) {
              __n = (Node *)((long)local_d0->wcost + local_d0->prev->cost);
              n = local_d0->cost - (long)__n;
              goto LAB_0012b7f6;
            }
            __n = (Node *)&node->rlength;
            if (bVar3 == 0x4c) goto switchD_0012b5d3_caseD_6c;
            __n = local_c0;
            if (bVar3 != 0x50) {
              if (bVar3 != 0x53) goto switchD_0012b5d3_caseD_64;
              StringBuffer::write(os,((int)local_d0->surface - (uint)local_d0->rlength) +
                                     (uint)local_d0->length,
                                  (void *)((ulong)local_d0->rlength - (ulong)local_d0->length),
                                  (size_t)local_c0);
              __buf_00 = (uint *)extraout_RDX_13;
              break;
            }
          }
          StringBuffer::operator<<(os,(double)*(float *)&__n->prev);
          __buf_00 = (uint *)extraout_RDX_14;
        }
        break;
      case (void *)0xd:
        pNVar4 = (Node *)&node->stat;
      case (void *)0xe:
        __n = pNVar4;
        StringBuffer::operator<<(os,(uint)*(byte *)&__n->prev);
        __buf_00 = (uint *)extraout_RDX_07;
        break;
      default:
        if (bVar3 == 0x25) {
          StringBuffer::write(os,0x25,(void *)(ulong)(bVar3 - 0x66),(size_t)__n);
          __buf_00 = (uint *)extraout_RDX_10;
        }
        else {
          if (bVar3 != 99) goto switchD_0012b430_caseD_67;
          StringBuffer::operator<<(os,(int)local_d0->wcost);
          __buf_00 = (uint *)extraout_RDX_03;
        }
      }
    }
LAB_0012b450:
    p = (char *)(pbVar11 + 1);
  }
LAB_0012b8a8:
  scoped_fixed_array<char_*,_64>::~scoped_fixed_array(&ptr);
  scoped_fixed_array<char,_8192>::~scoped_fixed_array(&buf);
  return bVar2 == 0;
}

Assistant:

bool Writer::writeNode(Lattice *lattice,
                       const char *p,
                       const Node *node,
                       StringBuffer *os) const {
  scoped_fixed_array<char, BUF_SIZE> buf;
  scoped_fixed_array<char *, 64> ptr;
  size_t psize = 0;

  for (; *p; p++) {
    switch (*p) {
      default: *os << *p; break;

      case '\\': *os << getEscapedChar(*++p); break;

      case '%': {  // macros
        switch (*++p) {
          default: {
            const std::string error = "unknown meta char: " + *p;
            lattice->set_what(error.c_str());
            return false;
          }
            // input sentence
          case 'S': os->write(lattice->sentence(), lattice->size()); break;
            // sentence length
          case 'L': *os << lattice->size(); break;
            // morph
          case 'm': os->write(node->surface, node->length); break;
          case 'M': os->write(reinterpret_cast<const char *>
                              (node->surface - node->rlength + node->length),
                              node->rlength);
            break;
          case 'h': *os << node->posid; break;  // Part-Of-Speech ID
          case '%': *os << '%'; break;         // %
          case 'c': *os << static_cast<int>(node->wcost); break;  // word cost
          case 'H': *os << node->feature; break;
          case 't': *os << static_cast<unsigned int>(node->char_type); break;
          case 's': *os << static_cast<unsigned int>(node->stat); break;
          case 'P': *os << node->prob; break;
          case 'p': {
            switch (*++p) {
              default:
                lattice->set_what("[iseSCwcnblLh] is required after %p");
                return false;
              case 'i': *os << node->id; break;  // node id
              case 'S': os->write(reinterpret_cast<const char*>
                                  (node->surface -
                                   node->rlength + node->length),
                                  node->rlength - node->length);
                break;  // space
                // start position
              case 's': *os << static_cast<int>(
                  node->surface - lattice->sentence());
                break;
                // end position
              case 'e': *os << static_cast<int>
                    (node->surface - lattice->sentence() + node->length);
                break;
                // connection cost
              case 'C': *os << node->cost -
                    node->prev->cost - node->wcost;
                break;
              case 'w': *os << node->wcost; break;  // word cost
              case 'c': *os << node->cost; break;  // best cost
              case 'n': *os << (node->cost - node->prev->cost); break;
                // node cost
                // * if best path, otherwise ' '
              case 'b': *os << (node->isbest ? '*' : ' '); break;
              case 'P': *os << node->prob; break;
              case 'A': *os << node->alpha; break;
              case 'B': *os << node->beta; break;
              case 'l': *os << node->length; break;  // length of morph
                // length of morph including the spaces
              case 'L': *os << node->rlength;    break;
              case 'h': {  // Hidden Layer ID
                switch (*++p) {
                  default:
                    lattice->set_what("lr is required after %ph");
                    return false;
                  case 'l': *os << node->lcAttr; break;   // current
                  case 'r': *os << node->rcAttr; break;   // prev
                }
              } break;

              case 'p': {
                char mode = *++p;
                char sep = *++p;
                if (sep == '\\') {
                  sep = getEscapedChar(*++p);
                }
                if (!node->lpath) {
                  lattice->set_what("no path information is available");
                  return false;
                }
                for (Path *path = node->lpath; path; path = path->lnext) {
                  if (path != node->lpath) *os << sep;
                  switch (mode) {
                    case 'i': *os << path->lnode->id; break;
                    case 'c': *os << path->cost; break;
                    case 'P': *os << path->prob; break;
                    default:
                      lattice->set_what("[icP] is required after %pp");
                      return false;
                  }
                }
              } break;

            }
          } break;

          case 'F':
          case 'f': {
            if (node->feature[0] == '\0') {
              lattice->set_what("no feature information available");
              return false;
            }
            if (!psize) {
              std::strncpy(buf.get(), node->feature, buf.size());
              psize = tokenizeCSV(buf.get(), ptr.get(), ptr.size());
            }

            // separator
            char separator = '\t';  // default separator
            if (*p == 'F') {  // change separator
              if (*++p == '\\') {
                separator = getEscapedChar(*++p);
              } else {
                separator = *p;
              }
            }

            if (*++p !='[') {
              lattice->set_what("cannot find '['");
              return false;
            }
            size_t n = 0;
            bool sep = false;
            bool isfil = false;
            p++;

            for (;; ++p) {
              switch (*p) {
                case '0': case '1': case '2': case '3': case '4':
                case '5': case '6': case '7': case '8': case '9':
                  n = 10 * n +(*p - '0');
                  break;
                case ',': case ']':
                  if (n >= psize) {
                    lattice->set_what("given index is out of range");
                    return false;
                  }
                  isfil = (ptr[n][0] != '*');
                  if (isfil) {
                    if (sep) {
                      *os << separator;
                    }
                    *os << ptr[n];
                  }
                  if (*p == ']') {
                    goto last;
                  }
                  sep = isfil;
                  n = 0;
                  break;
                default:
                  lattice->set_what("cannot find ']'");
                  return false;
              }
            }
          } last: break;
        }  // end switch
      } break;  // end case '%'
    }  // end switch
  }

  return true;
}